

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_triangle
               (nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_vec2 c,nk_color col,float thickness)

{
  float thickness_local;
  nk_draw_list *list_local;
  nk_color col_local;
  nk_vec2 c_local;
  nk_vec2 b_local;
  nk_vec2 a_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x226f,
                  "void nk_draw_list_stroke_triangle(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_color, float)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (list_local._7_1_ = col.a, list_local._7_1_ != '\0')) {
    nk_draw_list_path_line_to(list,a);
    nk_draw_list_path_line_to(list,b);
    nk_draw_list_path_line_to(list,c);
    nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_triangle(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, struct nk_vec2 c, struct nk_color col, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    nk_draw_list_path_line_to(list, a);
    nk_draw_list_path_line_to(list, b);
    nk_draw_list_path_line_to(list, c);
    nk_draw_list_path_stroke(list, col, NK_STROKE_CLOSED, thickness);
}